

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManRehashClassNodes(Iso_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  Iso_Obj_t *pIVar8;
  
  p->vTemp1->nSize = 0;
  p->vTemp2->nSize = 0;
  pVVar3 = p->vClasses;
  if (0 < pVVar3->nSize) {
    lVar7 = 0;
    do {
      pIVar8 = (Iso_Obj_t *)pVVar3->pArray[lVar7];
      while (pIVar8 != (Iso_Obj_t *)0x0) {
        if (pIVar8->Id == 0) {
          pVVar3 = p->vTemp1;
        }
        else {
          pVVar3 = p->vTemp2;
        }
        uVar1 = pVVar3->nCap;
        if (pVVar3->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar1 * 2;
            if (iVar6 <= (int)uVar1) goto LAB_00629f5e;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
            }
            pVVar3->pArray = ppvVar4;
          }
          pVVar3->nCap = iVar6;
        }
LAB_00629f5e:
        iVar6 = pVVar3->nSize;
        pVVar3->nSize = iVar6 + 1;
        pVVar3->pArray[iVar6] = pIVar8;
        iVar6 = pIVar8->iClass;
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                        ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
        }
        if (iVar6 == 0) {
          pIVar8 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar8 = p->pObjs + iVar6;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar3 = p->vClasses;
    } while (lVar7 < pVVar3->nSize);
  }
  p->nClasses = 0;
  p->nEntries = 0;
  p->nSingles = 0;
  memset(p->pBins,0,(long)p->nBins << 2);
  pVVar3 = p->vTemp1;
  if (0 < pVVar3->nSize) {
    lVar7 = 0;
    do {
      pIVar8 = (Iso_Obj_t *)pVVar3->pArray[lVar7];
      if (pIVar8->Id != 0) {
        __assert_fail("pTemp->Id == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x3d8,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
      }
      pIVar8->iNext = 0;
      pIVar8->iClass = 0;
      Iso_ObjHashAdd(p,pIVar8);
      lVar7 = lVar7 + 1;
      pVVar3 = p->vTemp1;
    } while (lVar7 < pVVar3->nSize);
  }
  lVar7 = (long)p->vTemp2->nSize;
  if (0 < lVar7) {
    ppvVar4 = p->vTemp2->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar4[lVar5];
      if (*(int *)((long)pvVar2 + 0x14) == 0) {
        __assert_fail("pTemp->Id != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x3de,"void Iso_ManRehashClassNodes(Iso_Man_t *)");
      }
      *(undefined8 *)((long)pvVar2 + 0xc) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  Iso_ManCollectClasses(p);
  return;
}

Assistant:

void Iso_ManRehashClassNodes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i;
    // collect nodes
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            if ( pTemp->Id == 0 )
                Vec_PtrPush( p->vTemp1, pTemp );
            else
                Vec_PtrPush( p->vTemp2, pTemp );
    }
    // clean and add nodes
    p->nClasses = 0;       // total number of classes
    p->nEntries = 0;       // total number of entries
    p->nSingles = 0;       // total number of singletons
    memset( p->pBins, 0, sizeof(int) * p->nBins );
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp1, pTemp, i )
    {
        assert( pTemp->Id == 0 );
        pTemp->iClass = pTemp->iNext = 0;
        Iso_ObjHashAdd( p, pTemp );
    }
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vTemp2, pTemp, i )
    {
        assert( pTemp->Id != 0 );
        pTemp->iClass = pTemp->iNext = 0;
    }
    // collect new classes
    Iso_ManCollectClasses( p );
}